

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O1

void __thiscall ezc3d::c3d::frame(c3d *this,Frame *f,size_t idx,bool skipInternalUpdates)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Parameters *pPVar3;
  bool bVar4;
  int iVar5;
  Group *pGVar6;
  Parameter *pPVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  Points *pPVar9;
  size_t sVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  vector<double,_std::allocator<double>_> *pvVar11;
  Analogs *pAVar12;
  SubFrame *this_00;
  size_t sVar13;
  runtime_error *prVar14;
  undefined3 in_register_00000009;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  string local_110;
  string local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  string local_b8;
  string local_98;
  string local_70;
  string local_50;
  
  DataNS::Data::frame((this->_data).
                      super___shared_ptr<ezc3d::DataNS::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr,f,
                      idx);
  if (CONCAT31(in_register_00000009,skipInternalUpdates) != 0) {
    return;
  }
  pPVar3 = (this->_parameters).
           super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar1 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"POINT","");
  pGVar6 = ParametersNS::Parameters::group(pPVar3,&local_110);
  paVar2 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"USED","");
  pPVar7 = ParametersNS::GroupNS::Group::parameter(pGVar6,&local_f0);
  pvVar8 = ParametersNS::GroupNS::Parameter::valuesAsInt(pPVar7);
  iVar5 = *(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (iVar5 != 0) {
    pPVar9 = DataNS::Frame::points(f);
    sVar10 = DataNS::Points3dNS::Points::nbPoints(pPVar9);
    if (sVar10 != (long)iVar5) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar14,
                 "Number of points in POINT:USED parameter must equal to the number of points sent in the frame"
                );
      __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pPVar3 = (this->_parameters).
           super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"POINT","");
  pGVar6 = ParametersNS::Parameters::group(pPVar3,&local_110);
  local_f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"LABELS","");
  pPVar7 = ParametersNS::GroupNS::Group::parameter(pGVar6,&local_f0);
  __x = ParametersNS::GroupNS::Parameter::valuesAsString_abi_cxx11_(pPVar7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d0,__x);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  pointNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_110,this);
  if (local_d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar17 = 0;
    do {
      if ((pointer)local_110._M_string_length != local_110._M_dataplus._M_p) {
        lVar15 = 0;
        uVar16 = 0;
        do {
          iVar5 = std::__cxx11::string::compare((string *)(local_110._M_dataplus._M_p + lVar15));
          if (iVar5 == 0) break;
          uVar16 = uVar16 + 1;
          lVar15 = lVar15 + 0x20;
        } while (uVar16 < (ulong)((long)(local_110._M_string_length -
                                        (long)local_110._M_dataplus._M_p) >> 5));
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)((long)local_d0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_d0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_110);
  pPVar9 = DataNS::Frame::points(f);
  sVar10 = DataNS::Points3dNS::Points::nbPoints(pPVar9);
  if (sVar10 == 0) {
    bVar4 = false;
  }
  else {
    pPVar3 = (this->_parameters).
             super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"POINT","");
    pGVar6 = ParametersNS::Parameters::group(pPVar3,&local_110);
    local_f0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"RATE","");
    pPVar7 = ParametersNS::GroupNS::Group::parameter(pGVar6,&local_f0);
    pvVar11 = ParametersNS::GroupNS::Parameter::valuesAsDouble(pPVar7);
    bVar4 = *(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start == 0.0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar4) {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar14,"Point frame rate must be specified if you add some");
  }
  else {
    pAVar12 = DataNS::Frame::analogs(f);
    sVar10 = DataNS::AnalogsNS::Analogs::nbSubframes(pAVar12);
    if (sVar10 == 0) {
      bVar4 = false;
    }
    else {
      pPVar3 = (this->_parameters).
               super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ANALOG","");
      pGVar6 = ParametersNS::Parameters::group(pPVar3,&local_50);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"RATE","");
      pPVar7 = ParametersNS::GroupNS::Group::parameter(pGVar6,&local_70);
      pvVar11 = ParametersNS::GroupNS::Parameter::valuesAsDouble(pPVar7);
      bVar4 = *(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start == 0.0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (!bVar4) {
      pPVar3 = (this->_parameters).
               super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ANALOG","");
      pGVar6 = ParametersNS::Parameters::group(pPVar3,&local_98);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"USED","");
      pPVar7 = ParametersNS::GroupNS::Group::parameter(pGVar6,&local_b8);
      pvVar8 = ParametersNS::GroupNS::Parameter::valuesAsInt(pPVar7);
      iVar5 = *(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      pAVar12 = DataNS::Frame::analogs(f);
      sVar10 = DataNS::AnalogsNS::Analogs::nbSubframes(pAVar12);
      if (sVar10 != 0) {
        pAVar12 = DataNS::Frame::analogs(f);
        this_00 = DataNS::AnalogsNS::Analogs::subframe(pAVar12,0);
        sVar10 = DataNS::AnalogsNS::SubFrame::nbChannels(this_00);
        sVar13 = Header::nbAnalogByFrame
                           ((this->_header).
                            super___shared_ptr<ezc3d::Header,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if ((sVar10 != (long)iVar5) && (iVar5 != 0 || sVar13 != 0)) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar14,
                     "Number of analogs in ANALOG:USED parameter must equal the number of analogs sent in the frame"
                    );
          __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      local_98._M_dataplus._M_p = (pointer)0x0;
      local_98._M_string_length = 0;
      local_98.field_2._M_allocated_capacity = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      updateParameters(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_98,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d0);
      return;
    }
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar14,"Analog frame rate must be specified if you add some")
    ;
  }
  __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ezc3d::c3d::frame(const ezc3d::DataNS::Frame &f, size_t idx,
                       bool skipInternalUpdates) {

  // Replace the jth frame
  _data->frame(f, idx);

  if (skipInternalUpdates)
    return;

  // Make sure f.points().points() is the same as data.f[ANY].points()
  size_t nPoints(static_cast<size_t>(
      parameters().group("POINT").parameter("USED").valuesAsInt()[0]));
  if (nPoints != 0 && f.points().nbPoints() != nPoints)
    throw std::runtime_error(
        "Number of points in POINT:USED parameter must equal to "
        "the number of points sent in the frame");

  std::vector<std::string> labels(
      parameters().group("POINT").parameter("LABELS").valuesAsString());

  try {
    // Check if all the labels are in the actual LABELSX parameter
    const std::vector<std::string> &namesParameter(pointNames());
    for (size_t i = 0; i < labels.size(); ++i) {
      for (size_t i = 0; i < namesParameter.size(); ++i) {
        if (!namesParameter[i].compare(labels[i])) {
          break;
        }
      }
    }
  } catch (const std::invalid_argument&) {
    throw std::invalid_argument("All the points in the frame must appear "
                                "in the POINT:LABELS parameter");
  }

  if (f.points().nbPoints() > 0 &&
      parameters().group("POINT").parameter("RATE").valuesAsDouble()[0] ==
          0.0) {
    throw std::runtime_error(
        "Point frame rate must be specified if you add some");
  }
  if (f.analogs().nbSubframes() > 0 &&
      parameters().group("ANALOG").parameter("RATE").valuesAsDouble()[0] ==
          0.0) {
    throw std::runtime_error(
        "Analog frame rate must be specified if you add some");
  }

  size_t nAnalogs(static_cast<size_t>(
      parameters().group("ANALOG").parameter("USED").valuesAsInt()[0]));
  size_t subSize(f.analogs().nbSubframes());
  if (subSize != 0) {
    size_t nChannel(f.analogs().subframe(0).nbChannels());
    size_t nAnalogByFrames(header().nbAnalogByFrame());
    if (!(nAnalogs == 0 && nAnalogByFrames == 0) && nChannel != nAnalogs)
      throw std::runtime_error(
          "Number of analogs in ANALOG:USED parameter must equal "
          "the number of analogs sent in the frame");
  }

  // Finalize the internal structure
  updateParameters();
}